

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Matchers::Impl::StdString::StartsWith::toString_abi_cxx11_
          (string *__return_storage_ptr__,StartsWith *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  StartsWith *local_18;
  StartsWith *this_local;
  
  local_18 = this;
  this_local = (StartsWith *)__return_storage_ptr__;
  std::operator+(&local_38,"starts with: \"",&this->m_substr);
  std::operator+(__return_storage_ptr__,&local_38,"\"");
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string toString() const {
                return "starts with: \"" + m_substr + "\"";
            }